

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Highs.cpp
# Opt level: O3

HighsStatus __thiscall Highs::setSolution(Highs *this,HighsSolution *solution)

{
  HighsSolution *solution_00;
  function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
  *pfVar1;
  int iVar2;
  HighsStatus HVar3;
  HighsStatus HVar4;
  size_type sVar5;
  ulong uVar6;
  bool bVar7;
  bool bVar8;
  string local_120;
  HighsSolution *local_100;
  HighsLogOptions local_f8;
  HighsLogOptions local_98;
  
  uVar6 = (ulong)(this->model_).lp_.num_col_;
  if ((long)uVar6 < 1) {
    bVar7 = false;
  }
  else {
    bVar7 = uVar6 <= (ulong)((long)(solution->col_value).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_finish -
                             (long)(solution->col_value).
                                   super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                   super__Vector_impl_data._M_start >> 3);
  }
  iVar2 = (this->model_).lp_.num_row_;
  if ((long)iVar2 < 1) {
    bVar8 = false;
  }
  else {
    bVar8 = (ulong)(long)iVar2 <=
            (ulong)((long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_finish -
                    (long)(solution->row_dual).super__Vector_base<double,_std::allocator<double>_>.
                          _M_impl.super__Vector_impl_data._M_start >> 3);
  }
  if (bVar7 || bVar8) {
    invalidateSolverData(this);
    HVar4 = kOk;
  }
  else {
    highsLogUser(&(this->options_).super_HighsOptionsStruct.log_options,kError,
                 "setSolution: User solution is rejected due to mismatch between size of col_value and row_dual vectors (%d, %d) and number of columns and rows in the model (%d, %d)\n"
                 ,(ulong)((long)(solution->col_value).
                                super__Vector_base<double,_std::allocator<double>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)(solution->col_value).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start) >> 3,
                 (ulong)((long)(solution->row_dual).
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish -
                        (long)(solution->row_dual).
                              super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start) >> 3,uVar6,iVar2);
    HVar4 = kError;
  }
  if (bVar7) {
    solution_00 = &this->solution_;
    std::vector<double,_std::allocator<double>_>::operator=
              (&(this->solution_).col_value,&solution->col_value);
    sVar5 = (size_type)(this->model_).lp_.num_row_;
    local_100 = solution_00;
    if ((long)sVar5 < 1) {
LAB_0020d020:
      local_100->value_valid = true;
      goto LAB_0020d028;
    }
    std::vector<double,_std::allocator<double>_>::resize(&(this->solution_).row_value,sVar5);
    HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
    local_98.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
    local_98.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
    local_98.log_to_console = (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
    local_98.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level;
    local_98.user_log_callback =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
    local_98.user_log_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
    pfVar1 = &local_98.user_callback;
    std::
    function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
    ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
    local_98.user_callback_active =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
    local_98.user_callback_data =
         (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
    HVar3 = calculateRowValuesQuad(&(this->model_).lp_,solution_00,-1);
    local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_120,"calculateRowValuesQuad","");
    HVar4 = interpretCallStatus(&local_98,HVar3,HVar4,&local_120);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_120._M_dataplus._M_p != &local_120.field_2) {
      operator_delete(local_120._M_dataplus._M_p);
    }
    if (local_98.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
      (*local_98.user_callback.super__Function_base._M_manager)
                ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
    }
    if (HVar4 != kError) goto LAB_0020d020;
LAB_0020d13d:
    HVar4 = kError;
  }
  else {
LAB_0020d028:
    if (bVar8) {
      std::vector<double,_std::allocator<double>_>::operator=
                (&(this->solution_).row_dual,&solution->row_dual);
      sVar5 = (size_type)(this->model_).lp_.num_col_;
      if (0 < (long)sVar5) {
        std::vector<double,_std::allocator<double>_>::resize(&(this->solution_).col_dual,sVar5);
        HighsSparseMatrix::ensureColwise(&(this->model_).lp_.a_matrix_);
        local_f8.log_stream = (this->options_).super_HighsOptionsStruct.log_options.log_stream;
        local_f8.output_flag = (this->options_).super_HighsOptionsStruct.log_options.output_flag;
        local_f8.log_to_console =
             (this->options_).super_HighsOptionsStruct.log_options.log_to_console;
        local_f8.log_dev_level = (this->options_).super_HighsOptionsStruct.log_options.log_dev_level
        ;
        local_f8.user_log_callback =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback;
        local_f8.user_log_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_log_callback_data;
        pfVar1 = &local_f8.user_callback;
        std::
        function<void_(int,_const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_const_HighsCallbackDataOut_*,_HighsCallbackDataIn_*,_void_*)>
        ::function(pfVar1,&(this->options_).super_HighsOptionsStruct.log_options.user_callback);
        local_f8.user_callback_active =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_active;
        local_f8.user_callback_data =
             (this->options_).super_HighsOptionsStruct.log_options.user_callback_data;
        HVar3 = calculateColDualsQuad(&(this->model_).lp_,&this->solution_);
        local_120._M_dataplus._M_p = (pointer)&local_120.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_120,"calculateColDuals","")
        ;
        HVar4 = interpretCallStatus(&local_f8,HVar3,HVar4,&local_120);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_120._M_dataplus._M_p != &local_120.field_2) {
          operator_delete(local_120._M_dataplus._M_p);
        }
        if (local_f8.user_callback.super__Function_base._M_manager != (_Manager_type)0x0) {
          (*local_f8.user_callback.super__Function_base._M_manager)
                    ((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
        }
        if (HVar4 == kError) goto LAB_0020d13d;
      }
      (this->solution_).dual_valid = true;
    }
    HVar4 = returnFromHighs(this,HVar4);
  }
  return HVar4;
}

Assistant:

HighsStatus Highs::setSolution(const HighsSolution& solution) {
  HighsStatus return_status = HighsStatus::kOk;
  // Determine whether a new solution will be defined. If so,
  // the old solution and any basis are cleared
  const bool new_primal_solution =
      model_.lp_.num_col_ > 0 &&
      solution.col_value.size() >= static_cast<size_t>(model_.lp_.num_col_);
  const bool new_dual_solution =
      model_.lp_.num_row_ > 0 &&
      solution.row_dual.size() >= static_cast<size_t>(model_.lp_.num_row_);
  const bool new_solution = new_primal_solution || new_dual_solution;

  if (new_solution) {
    invalidateSolverData();
  } else {
    // Solution is rejected, so give a logging message and error
    // return
    highsLogUser(
        options_.log_options, HighsLogType::kError,
        "setSolution: User solution is rejected due to mismatch between "
        "size of col_value and row_dual vectors (%d, %d) and number "
        "of columns and rows in the model (%d, %d)\n",
        int(solution.col_value.size()), int(solution.row_dual.size()),
        int(model_.lp_.num_col_), int(model_.lp_.num_row_));
    return_status = HighsStatus::kError;
  }

  if (new_primal_solution) {
    solution_.col_value = solution.col_value;
    if (model_.lp_.num_row_ > 0) {
      // Worth computing the row values
      solution_.row_value.resize(model_.lp_.num_row_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateRowValuesQuad(model_.lp_, solution_),
          return_status, "calculateRowValuesQuad");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.value_valid = true;
  }
  if (new_dual_solution) {
    solution_.row_dual = solution.row_dual;
    if (model_.lp_.num_col_ > 0) {
      // Worth computing the column duals
      solution_.col_dual.resize(model_.lp_.num_col_);
      // Matrix must be column-wise
      model_.lp_.a_matrix_.ensureColwise();
      return_status = interpretCallStatus(
          options_.log_options, calculateColDualsQuad(model_.lp_, solution_),
          return_status, "calculateColDuals");
      if (return_status == HighsStatus::kError) return return_status;
    }
    solution_.dual_valid = true;
  }
  return returnFromHighs(return_status);
}